

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void finalizeAggFunctions(Parse *pParse,AggInfo *pAggInfo)

{
  Vdbe *p;
  ExprList *pEVar1;
  FuncDef *p_00;
  Op *pOVar2;
  int iVar3;
  int iVar4;
  AggInfo_func *pAVar5;
  
  if (0 < pAggInfo->nFunc) {
    p = pParse->pVdbe;
    pAVar5 = pAggInfo->aFunc;
    iVar4 = 0;
    do {
      pEVar1 = (pAVar5->pExpr->x).pList;
      iVar3 = 0;
      if (pEVar1 != (ExprList *)0x0) {
        iVar3 = pEVar1->nExpr;
      }
      sqlite3VdbeAddOp3(p,0x9e,pAVar5->iMem,iVar3,0);
      p_00 = pAVar5->pFunc;
      if (p->db->mallocFailed == '\0') {
        pOVar2 = p->aOp;
        iVar3 = p->nOp;
        pOVar2[(long)iVar3 + -1].p4type = -8;
        pOVar2[(long)iVar3 + -1].p4.pKeyInfo = (KeyInfo *)p_00;
      }
      else if ((p_00->funcFlags & 0x10) != 0) {
        sqlite3DbFreeNN(p->db,p_00);
      }
      iVar4 = iVar4 + 1;
      pAVar5 = pAVar5 + 1;
    } while (iVar4 < pAggInfo->nFunc);
  }
  return;
}

Assistant:

static void finalizeAggFunctions(Parse *pParse, AggInfo *pAggInfo){
  Vdbe *v = pParse->pVdbe;
  int i;
  struct AggInfo_func *pF;
  for(i=0, pF=pAggInfo->aFunc; i<pAggInfo->nFunc; i++, pF++){
    ExprList *pList = pF->pExpr->x.pList;
    assert( !ExprHasProperty(pF->pExpr, EP_xIsSelect) );
    sqlite3VdbeAddOp2(v, OP_AggFinal, pF->iMem, pList ? pList->nExpr : 0);
    sqlite3VdbeAppendP4(v, pF->pFunc, P4_FUNCDEF);
  }
}